

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merger.cc
# Opt level: O1

Status __thiscall leveldb::anon_unknown_0::MergingIterator::status(MergingIterator *this)

{
  long lVar1;
  long in_RSI;
  long in_FS_OFFSET;
  Iterator *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)0x0;
  if (*(int *)(in_RSI + 0x38) < 1) {
    local_40 = (Iterator *)0x0;
  }
  else {
    lVar1 = 0;
    do {
      IteratorWrapper::status((IteratorWrapper *)&local_40);
      if (local_40 != (Iterator *)0x0) break;
      lVar1 = lVar1 + 1;
    } while (lVar1 < *(int *)(in_RSI + 0x38));
  }
  (this->super_Iterator)._vptr_Iterator = (_func_int **)local_40;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status status() const override {
    Status status;
    for (int i = 0; i < n_; i++) {
      status = children_[i].status();
      if (!status.ok()) {
        break;
      }
    }
    return status;
  }